

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateCFBundle
          (cmOSXBundleGenerator *this,string *targetName,string *root,string *config)

{
  bool bVar1;
  string plist;
  string name;
  string out;
  string local_80;
  cmAlphaNum local_60;
  
  bVar1 = MustSkip(this);
  if (!bVar1) {
    name._M_string_length = (size_type)(root->_M_dataplus)._M_p;
    name._M_dataplus._M_p = (pointer)root->_M_string_length;
    local_60.View_._M_len = 1;
    local_60.Digits_[0] = '/';
    local_60.View_._M_str = local_60.Digits_;
    cmGeneratorTarget::GetCFBundleDirectory(&plist,this->GT,config,FullLevel);
    cmStrCat<std::__cxx11::string>(&out,(cmAlphaNum *)&name,&local_60,&plist);
    std::__cxx11::string::~string((string *)&plist);
    cmsys::SystemTools::MakeDirectory(&out,(mode_t *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&out);
    name._M_string_length = (size_type)(root->_M_dataplus)._M_p;
    name._M_dataplus._M_p = (pointer)root->_M_string_length;
    local_60.View_._M_len = 1;
    local_60.Digits_[0] = '/';
    local_60.View_._M_str = local_60.Digits_;
    cmGeneratorTarget::GetCFBundleDirectory(&local_80,this->GT,config,ContentLevel);
    cmStrCat<std::__cxx11::string,char[12]>
              (&plist,(cmAlphaNum *)&name,&local_60,&local_80,(char (*) [12])"/Info.plist");
    std::__cxx11::string::~string((string *)&local_80);
    cmsys::SystemTools::GetFilenameName(&name,targetName);
    cmLocalGenerator::GenerateAppleInfoPList(this->LocalGenerator,this->GT,&name,&plist);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&plist);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&out);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root,
                                          const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, name, plist);
  this->Makefile->AddCMakeOutputFile(plist);
}